

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall r_code::SysView::trace(SysView *this)

{
  bool bVar1;
  ostream *poVar2;
  size_t sVar3;
  vector<r_code::Atom> *this_00;
  reference this_01;
  vector<unsigned_int> *this_02;
  reference puVar4;
  iterator iStack_48;
  uint32_t reference;
  iterator __end1_1;
  iterator __begin1_1;
  vector<unsigned_int> *__range1_1;
  Atom *atom;
  iterator __end1;
  iterator __begin1;
  vector<r_code::Atom> *__range1;
  SysView *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout," code size: ");
  sVar3 = vector<r_code::Atom>::size(&(this->super_ImageObject).code);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout," reference set size: ");
  sVar3 = vector<unsigned_int>::size(&(this->super_ImageObject).references);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"---code---");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  this_00 = &(this->super_ImageObject).code;
  __end1 = vector<r_code::Atom>::begin(this_00);
  atom = (Atom *)vector<r_code::Atom>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<r_code::Atom_*,_std::vector<r_code::Atom,_std::allocator<r_code::Atom>_>_>
                                *)&atom);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<r_code::Atom_*,_std::vector<r_code::Atom,_std::allocator<r_code::Atom>_>_>
              ::operator*(&__end1);
    Atom::trace(this_01);
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<r_code::Atom_*,_std::vector<r_code::Atom,_std::allocator<r_code::Atom>_>_>::
    operator++(&__end1);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"---reference set---");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  this_02 = &(this->super_ImageObject).references;
  __end1_1 = vector<unsigned_int>::begin(this_02);
  iStack_48 = vector<unsigned_int>::end(this_02);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1_1,&stack0xffffffffffffffb8);
    if (!bVar1) break;
    puVar4 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end1_1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*puVar4);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&__end1_1);
  }
  return;
}

Assistant:

void SysView::trace()
{
    std::cout << " code size: " << code.size() << std::endl;
    std::cout << " reference set size: " << references.size() << std::endl;
    std::cout << "---code---" << std::endl;

    for (const Atom &atom : code) {
        atom.trace();
        std::cout << std::endl;
    }

    std::cout << "---reference set---" << std::endl;

    for (uint32_t reference : references) {
        std::cout << reference << std::endl;
    }
}